

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.cpp
# Opt level: O3

void __thiscall QDebug::putQtOrdering(QDebug *this,QtOrderingTypeFlag flags,partial_ordering order)

{
  char *pcVar1;
  char *__s;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.field_2._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._M_string_length = 0;
  local_48.field_2._M_allocated_capacity = 0xaaaaaaaaaaaaaa00;
  pcVar1 = "std";
  if (((uint)flags.super_QFlagsStorageHelper<QtOrderingPrivate::QtOrderingType,_4>.
             super_QFlagsStorage<QtOrderingPrivate::QtOrderingType>.i & 1) == 0) {
    pcVar1 = "Qt";
  }
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_48,pcVar1);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_48,"::");
  pcVar1 = "weak";
  if (((uint)flags.super_QFlagsStorageHelper<QtOrderingPrivate::QtOrderingType,_4>.
             super_QFlagsStorage<QtOrderingPrivate::QtOrderingType>.i & 0x20) == 0) {
    pcVar1 = "partial";
  }
  __s = "strong";
  if (((uint)flags.super_QFlagsStorageHelper<QtOrderingPrivate::QtOrderingType,_4>.
             super_QFlagsStorage<QtOrderingPrivate::QtOrderingType>.i & 0x40) == 0) {
    __s = pcVar1;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_48,__s);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_48,"_ordering::");
  if (order.m_order == -1) {
    pcVar1 = "less";
  }
  else if (order.m_order == '\x01') {
    pcVar1 = "greater";
  }
  else if (order.m_order == '\0') {
    pcVar1 = "equal";
    if (((uint)flags.super_QFlagsStorageHelper<QtOrderingPrivate::QtOrderingType,_4>.
               super_QFlagsStorage<QtOrderingPrivate::QtOrderingType>.i & 0x40) == 0) {
      pcVar1 = "equivalent";
    }
  }
  else {
    pcVar1 = "unordered";
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_48,pcVar1);
  ::QTextStream::operator<<(&this->stream->ts,local_48._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDebug::putQtOrdering(QtOrderingPrivate::QtOrderingTypeFlag flags, Qt::partial_ordering order)
{
    using QtOrderingPrivate::QtOrderingType;
    std::string result;
    if ((flags & QtOrderingType::StdOrder) == QtOrderingType::StdOrder)
        result += "std";
    else if ((flags & QtOrderingType::QtOrder) == QtOrderingType::QtOrder)
        result += "Qt";

    result += "::";
    const bool isStrong = ((flags & QtOrderingType::Strong) == QtOrderingType::Strong);
    if (isStrong)
        result += "strong";
    else if ((flags & QtOrderingType::Weak) == QtOrderingType::Weak)
        result += "weak";
    else if ((flags & QtOrderingType::Partial) == QtOrderingType::Partial)
        result += "partial";
    result += "_ordering::";

    if (order == Qt::partial_ordering::equivalent) {
        if (isStrong)
            result += "equal";
        else
            result += "equivalent";
    } else if (order == Qt::partial_ordering::greater) {
        result += "greater";
    } else if (order == Qt::partial_ordering::less) {
        result += "less";
    } else {
        result += "unordered";
    }
    stream->ts << result.data();
}